

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_ALGORITHM_DESCRIPTION_Unmarshal
                 (TPMS_ALGORITHM_DESCRIPTION *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT16_Unmarshal(&target->alg,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMA_ALGORITHM_Unmarshal(&target->attributes,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_ALGORITHM_DESCRIPTION_Unmarshal(TPMS_ALGORITHM_DESCRIPTION *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->alg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_ALGORITHM_Unmarshal((TPMA_ALGORITHM *)&(target->attributes), buffer, size);
    return result;
}